

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcDoorStyle::IfcDoorStyle(IfcDoorStyle *this)

{
  IfcDoorStyle *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1d8,"IfcDoorStyle");
  IfcTypeProduct::IfcTypeProduct(&this->super_IfcTypeProduct,&PTR_construction_vtable_24__00f82680);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDoorStyle,_4UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcDoorStyle,_4UL> *)
             &(this->super_IfcTypeProduct).field_0x148,&PTR_construction_vtable_24__00f82730);
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject = 0xf825a0;
  *(undefined8 *)&this->field_0x1d8 = 0xf82668;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x88 = 0xf825c8;
  (this->super_IfcTypeProduct).super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0xf825f0;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0xf0 = 0xf82618;
  *(undefined8 *)&(this->super_IfcTypeProduct).field_0x148 = 0xf82640;
  std::__cxx11::string::string((string *)&(this->super_IfcTypeProduct).field_0x158);
  std::__cxx11::string::string((string *)&this->ConstructionType);
  std::__cxx11::string::string((string *)&this->ParameterTakesPrecedence);
  std::__cxx11::string::string((string *)&this->Sizeable);
  return;
}

Assistant:

IfcDoorStyle() : Object("IfcDoorStyle") {}